

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_acl_next
                  (archive_entry *entry,wchar_t want_type,wchar_t *type,wchar_t *permset,
                  wchar_t *tag,wchar_t *id,char **name)

{
  wchar_t wVar1;
  int *piVar2;
  wchar_t r;
  wchar_t *id_local;
  wchar_t *tag_local;
  wchar_t *permset_local;
  wchar_t *type_local;
  wchar_t want_type_local;
  archive_entry *entry_local;
  
  wVar1 = archive_acl_next(entry->archive,&entry->acl,want_type,type,permset,tag,id,name);
  if (wVar1 == L'\xffffffe2') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  return wVar1;
}

Assistant:

int
archive_entry_acl_next(struct archive_entry *entry, int want_type, int *type,
    int *permset, int *tag, int *id, const char **name)
{
	int r;
	r = archive_acl_next(entry->archive, &entry->acl, want_type, type,
		permset, tag, id, name);
	if (r == ARCHIVE_FATAL && errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (r);
}